

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

float __thiscall llvm::detail::IEEEFloat::convertToFloat(IEEEFloat *this)

{
  float fVar1;
  undefined1 local_20 [8];
  APInt api;
  IEEEFloat *this_local;
  
  api._8_8_ = this;
  if (this->semantics != (fltSemantics *)semIEEEsingle) {
    __assert_fail("semantics == (const llvm::fltSemantics*)&semIEEEsingle && \"Float semantics are not IEEEsingle\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xbcd,"float llvm::detail::IEEEFloat::convertToFloat() const");
  }
  bitcastToAPInt((IEEEFloat *)local_20);
  fVar1 = APInt::bitsToFloat((APInt *)local_20);
  APInt::~APInt((APInt *)local_20);
  return fVar1;
}

Assistant:

float IEEEFloat::convertToFloat() const {
  assert(semantics == (const llvm::fltSemantics*)&semIEEEsingle &&
         "Float semantics are not IEEEsingle");
  APInt api = bitcastToAPInt();
  return api.bitsToFloat();
}